

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::end_array(json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            *this)

{
  value_t vVar1;
  uint uVar2;
  pointer ppbVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar4;
  json_value jVar5;
  pointer ppbVar6;
  _Bit_type *p_Var7;
  array_t *paVar8;
  pointer pbVar9;
  bool bVar10;
  long *plVar11;
  long *plVar12;
  ulong *extraout_RDX;
  int in_ESI;
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  long *plStack_c8;
  long lStack_b8;
  long lStack_b0;
  string sStack_a8;
  string sStack_88;
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *pjStack_68;
  parse_event_t local_3d;
  int local_3c;
  undefined1 local_38 [8];
  json_value local_30;
  
  ppbVar3 = (this->ref_stack).
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = ppbVar3[-1];
  if (pbVar4 == (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)0x0) {
    bVar10 = true;
  }
  else {
    local_3c = (int)((ulong)((long)ppbVar3 -
                            (long)(this->ref_stack).
                                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3d = array_end;
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      this_00 = this;
      std::__throw_bad_function_call();
      sStack_a8._M_dataplus._M_p = (pointer)&sStack_a8.field_2;
      pjStack_68 = this;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a8,"out_of_range","");
      exception::name(&sStack_88,&sStack_a8,in_ESI);
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&sStack_88,*extraout_RDX);
      plVar12 = plVar11 + 2;
      if ((long *)*plVar11 == plVar12) {
        lStack_b8 = *plVar12;
        lStack_b0 = plVar11[3];
        plStack_c8 = &lStack_b8;
      }
      else {
        lStack_b8 = *plVar12;
        plStack_c8 = (long *)*plVar11;
      }
      *plVar11 = (long)plVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_88._M_dataplus._M_p != &sStack_88.field_2) {
        operator_delete(sStack_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_a8._M_dataplus._M_p != &sStack_a8.field_2) {
        operator_delete(sStack_a8._M_dataplus._M_p);
      }
      exception::exception((exception *)this_00,in_ESI,(char *)plStack_c8);
      this_00->root =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)&PTR__exception_00174178;
      if (plStack_c8 != &lStack_b8) {
        operator_delete(plStack_c8);
      }
      return SUB81(this_00,0);
    }
    bVar10 = (*(this->callback)._M_invoker)((_Any_data *)&this->callback,&local_3c,&local_3d,pbVar4)
    ;
    if (!bVar10) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_38,&this->discarded);
      pbVar4 = (this->ref_stack).
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_38);
      vVar1 = pbVar4->m_type;
      pbVar4->m_type = local_38[0];
      jVar5 = pbVar4->m_value;
      pbVar4->m_value = local_30;
      local_38[0] = vVar1;
      local_30 = jVar5;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pbVar4);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_38);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy
                ((json_value *)
                 &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_38)->m_value,local_38[0]);
    }
  }
  ppbVar3 = (this->ref_stack).
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppbVar6 = (this->ref_stack).
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppbVar3 != ppbVar6) {
    p_Var7 = (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar2 = (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    if (uVar2 != 0 ||
        (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != p_Var7) {
      (this->ref_stack).
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppbVar6 + -1;
      (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_offset = uVar2 - 1;
      if (uVar2 == 0) {
        (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var7 + -1;
      }
      if ((bVar10 == false && ppbVar3 != ppbVar6 + -1) && (ppbVar6[-2]->m_type == array)) {
        paVar8 = (ppbVar6[-2]->m_value).array;
        pbVar9 = (paVar8->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (paVar8->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar9 + -1;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar9 + -1);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&pbVar9[-1].m_value.boolean,pbVar9[-1].m_type);
      }
      return true;
    }
    __assert_fail("not keep_stack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/json/json.hpp"
                  ,0xc7d,
                  "bool nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::end_array() [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  __assert_fail("not ref_stack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/json/json.hpp"
                ,0xc7c,
                "bool nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::end_array() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

bool end_array()
    {
        bool keep = true;

        if (ref_stack.back())
        {
            keep = callback(static_cast<int>(ref_stack.size()) - 1, parse_event_t::array_end, *ref_stack.back());
            if (not keep)
            {
                // discard array
                *ref_stack.back() = discarded;
            }
        }

        assert(not ref_stack.empty());
        assert(not keep_stack.empty());
        ref_stack.pop_back();
        keep_stack.pop_back();

        // remove discarded value
        if (not keep and not ref_stack.empty() and ref_stack.back()->is_array())
        {
            ref_stack.back()->m_value.array->pop_back();
        }

        return true;
    }